

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

Index __thiscall
MADPComponentDiscreteObservations::GetObservationIndexByName
          (MADPComponentDiscreteObservations *this,string *s,Index agentI)

{
  pointer pvVar1;
  pointer pOVar2;
  __type_conflict _Var3;
  ostream *poVar4;
  E *pEVar5;
  ulong uVar6;
  Index unaff_EBP;
  pointer pOVar7;
  stringstream ss;
  ostream local_1a8 [376];
  
  if (this->_m_initialized == false) {
    pEVar5 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar5,"MADPComponentDiscreteObservations::GetObservationIndexByName - not initialized!");
    __cxa_throw(pEVar5,&E::typeinfo,E::~E);
  }
  pvVar1 = (this->_m_observationVecs).
           super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)agentI;
  if (uVar6 < (ulong)(((long)(this->_m_observationVecs).
                             super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18)) {
    pOVar7 = pvVar1[uVar6].
             super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>._M_impl.
             super__Vector_impl_data._M_start;
    pOVar2 = *(pointer *)
              ((long)&pvVar1[uVar6].
                      super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>.
                      _M_impl.super__Vector_impl_data + 8);
    do {
      if (pOVar7 == pOVar2) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar4 = std::operator<<(local_1a8,"GetObservationIndexByName - observation \"");
        poVar4 = std::operator<<(poVar4,(string *)s);
        poVar4 = std::operator<<(poVar4,"\" of agent ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," not found.");
        std::endl<char,std::char_traits<char>>(poVar4);
        pEVar5 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar5,&ss);
        __cxa_throw(pEVar5,&E::typeinfo,E::~E);
      }
      std::__cxx11::string::string
                ((string *)&ss,
                 (string *)&(pOVar7->super_Observation).super_NamedDescribedEntity._m_name);
      _Var3 = std::operator==(s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ss);
      if (_Var3) {
        unaff_EBP = (pOVar7->super_DiscreteEntity)._m_index;
      }
      else {
        pOVar7 = pOVar7 + 1;
      }
      std::__cxx11::string::~string((string *)&ss);
    } while (!_Var3);
    return unaff_EBP;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<(local_1a8,"GetObservationIndexByName -  Agent index (");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,") out of bounds! (_m_observationVecs contains observations");
  poVar4 = std::operator<<(poVar4," for ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," agents...)\n");
  pEVar5 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar5,&ss);
  __cxa_throw(pEVar5,&E::typeinfo,E::~E);
}

Assistant:

Index MADPComponentDiscreteObservations::GetObservationIndexByName(const string &s,
                                                                   Index agentI) const
{
    if(!_m_initialized)
        throw E("MADPComponentDiscreteObservations::GetObservationIndexByName - not initialized!");
    if(agentI >= _m_observationVecs.size())
    {
        stringstream ss;
        ss << "GetObservationIndexByName -  Agent index ("<<
            agentI<<") out of bounds! (_m_observationVecs contains observations"
            <<" for " << _m_observationVecs.size() << " agents...)\n";
        throw E(ss);
    }
    vector<ObservationDiscrete>::const_iterator it = 
    _m_observationVecs[agentI].begin();
    vector<ObservationDiscrete>::const_iterator last = 
    _m_observationVecs[agentI].end();
    while(it != last)
    {
        string s2 = (*it).GetName();
        if(s == s2)
            return( (*it).GetIndex() );
        it++;
    }
    //not found
    //return(-1);
    stringstream ss;
    ss << "GetObservationIndexByName - observation \"" << s << "\" of agent " <<
           agentI << " not found." << endl;
    throw E(ss);
}